

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::testDraw
          (FunctionalTest7_8 *this,GLuint *combination,vec4<float> *left,vec4<float> *right,
          vec4<unsigned_int> *indices)

{
  GLuint array_length;
  bool bVar1;
  GLuint i;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  byte bVar6;
  vec4<float> *out_combined;
  vec4<float> *this_00;
  GLuint i_1;
  long lVar7;
  bool results [7];
  GLuint subroutine_indices [4];
  vec4<float> expected_results [7];
  vec4<float> vec4_results [7];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  out_combined = expected_results;
  calculate((FunctionalTest7_8 *)(expected_results + 6),combination,left,right,indices,out_combined,
            expected_results + 1,expected_results + 2,expected_results + 3,expected_results + 4,
            expected_results + 5,expected_results + 6);
  (**(code **)(lVar7 + 0x15a0))
            (left->m_x,left->m_y,left->m_z,left->m_w,this->m_uniform_locations[0]);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Uniform4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x12f3);
  (**(code **)(lVar7 + 0x15a0))
            (right->m_x,right->m_y,right->m_z,right->m_w,this->m_uniform_locations[1]);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Uniform4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x12f6);
  (**(code **)(lVar7 + 0x15c0))
            (this->m_uniform_locations[2],indices->m_x,indices->m_y,indices->m_z,indices->m_w);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Uniform4ui",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x12f9);
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    subroutine_indices[this->m_subroutine_uniform_locations[lVar4]] =
         this->m_subroutine_indices[combination[lVar4]];
  }
  (**(code **)(lVar7 + 0x1668))(0x8b31,4,subroutine_indices);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1305);
  (**(code **)(lVar7 + 0x30))(0);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1309);
  (**(code **)(lVar7 + 0x538))(0,0,1);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x130c);
  (**(code **)(lVar7 + 0x638))();
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x130f);
  lVar5 = (**(code **)(lVar7 + 0xcf8))(0x8c8e,35000);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1313);
  for (lVar4 = 0xc; lVar4 != 0x7c; lVar4 = lVar4 + 0x10) {
    *(undefined4 *)((long)&expected_results[6].m_y + lVar4) = *(undefined4 *)(lVar5 + -0xc + lVar4);
    *(undefined4 *)((long)&expected_results[6].m_z + lVar4) = *(undefined4 *)(lVar5 + -8 + lVar4);
    *(undefined4 *)((long)&expected_results[6].m_w + lVar4) = *(undefined4 *)(lVar5 + -4 + lVar4);
    *(undefined4 *)((long)&vec4_results[0].m_x + lVar4) = *(undefined4 *)(lVar5 + lVar4);
  }
  array_length = *(GLuint *)(lVar5 + 0x70);
  (**(code **)(lVar7 + 0x1670))(0x8c8e);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1325);
  bVar6 = 1;
  this_00 = vec4_results;
  for (lVar7 = 0; lVar7 != 7; lVar7 = lVar7 + 1) {
    bVar1 = Utils::vec4<float>::operator==(this_00,out_combined);
    results[lVar7] = bVar1;
    bVar6 = bVar6 & bVar1;
    this_00 = this_00 + 1;
    out_combined = out_combined + 1;
  }
  bVar1 = (bool)(bVar6 & array_length == 4);
  if (bVar1 == false) {
    logError(this,combination,left,right,indices,expected_results,vec4_results,array_length,results)
    ;
  }
  return bVar1;
}

Assistant:

bool FunctionalTest7_8::testDraw(const glw::GLuint combination[4], const Utils::vec4<glw::GLfloat>& left,
								 const Utils::vec4<glw::GLfloat>& right, const Utils::vec4<glw::GLuint>& indices) const
{
	const glw::Functions& gl			  = m_context.getRenderContext().getFunctions();
	static const GLuint   n_vec4_varyings = 7;
	bool				  result		  = true;
	GLuint				  subroutine_indices[4];
	static const GLuint   n_subroutine_uniforms = sizeof(subroutine_indices) / sizeof(subroutine_indices[0]);

	/* Prepare expected results */
	Utils::vec4<glw::GLfloat> expected_results[7];
	calculate(combination, left, right, indices, expected_results[0], expected_results[1], expected_results[2],
			  expected_results[3], expected_results[4], expected_results[5], expected_results[6]);

	/* Set up input data uniforms */
	gl.uniform4f(m_uniform_locations[0], left.m_x, left.m_y, left.m_z, left.m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

	gl.uniform4f(m_uniform_locations[1], right.m_x, right.m_y, right.m_z, right.m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

	gl.uniform4ui(m_uniform_locations[2], indices.m_x, indices.m_y, indices.m_z, indices.m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4ui");

	/* Prepare subroutine uniform data */
	for (GLuint i = 0; i < n_subroutine_uniforms; ++i)
	{
		const GLuint location = m_subroutine_uniform_locations[i];

		subroutine_indices[location] = m_subroutine_indices[combination[i]];
	}

	/* Set up subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, n_subroutine_uniforms, &subroutine_indices[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Execute draw call with transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Capture results */
	GLvoid* feedback_data = (GLvoid*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	Utils::vec4<GLfloat> vec4_results[7];
	bool				 results[7];
	GLfloat*			 float_data = (GLfloat*)feedback_data;
	for (GLuint i = 0; i < n_vec4_varyings; ++i)
	{
		vec4_results[i].m_x = float_data[i * 4 + 0];
		vec4_results[i].m_y = float_data[i * 4 + 1];
		vec4_results[i].m_z = float_data[i * 4 + 2];
		vec4_results[i].m_w = float_data[i * 4 + 3];
	}

	GLuint* uint_data	= (GLuint*)(float_data + (n_vec4_varyings)*4);
	GLuint  array_length = uint_data[0];

	/* Unmap buffer */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Verification */
	for (GLuint i = 0; i < n_vec4_varyings; ++i)
	{
		results[i] = (vec4_results[i] == expected_results[i]);
		result	 = result && results[i];
	}

	result = result && (4 == array_length);

	/* Log error if any */
	if (false == result)
	{
		logError(combination, left, right, indices, expected_results, vec4_results, array_length, results);
	}

	/* Done */
	return result;
}